

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.cpp
# Opt level: O3

Matrix * Matrix::multiply(Matrix *m1,Matrix *m2)

{
  size_t rows;
  size_t sVar1;
  Matrix *pMVar2;
  double *pdVar3;
  size_t sVar4;
  long lVar5;
  size_t sVar6;
  long lVar7;
  size_t j;
  size_t sVar8;
  double *pdVar9;
  double dVar10;
  
  rows = m1->rows;
  if (rows == m2->cols) {
    pMVar2 = (Matrix *)operator_new(0x18);
    pMVar2->rows = rows;
    pMVar2->cols = rows;
    pdVar3 = ArrayHelper::getArray(rows,rows,false);
    pMVar2->data = pdVar3;
    if (rows != 0) {
      sVar1 = m1->cols;
      lVar5 = 0;
      sVar6 = 0;
      do {
        lVar7 = 0;
        sVar8 = 0;
        do {
          if (sVar1 == 0) {
            dVar10 = 0.0;
          }
          else {
            pdVar9 = (double *)((long)m2->data + lVar7);
            dVar10 = 0.0;
            sVar4 = 0;
            do {
              dVar10 = dVar10 + *(double *)((long)m1->data + sVar4 * 8 + lVar5) * *pdVar9;
              sVar4 = sVar4 + 1;
              pdVar9 = pdVar9 + m2->cols;
            } while (sVar1 != sVar4);
          }
          pdVar3[rows * sVar6 + sVar8] = dVar10;
          sVar8 = sVar8 + 1;
          lVar7 = lVar7 + 8;
        } while (sVar8 != rows);
        sVar6 = sVar6 + 1;
        lVar5 = lVar5 + sVar1 * 8;
      } while (sVar6 != rows);
    }
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Parameter 1 ROWS don\'t match Parameter 2 COLS",0x2d);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'x');
    std::ostream::put('x');
    std::ostream::flush();
    pMVar2 = (Matrix *)0x0;
  }
  return pMVar2;
}

Assistant:

Matrix* Matrix::multiply(Matrix* m1, Matrix* m2) {
	if (m1->rows != m2->cols) {
		std::cout << "Parameter 1 ROWS don't match Parameter 2 COLS" << std::endl;
		return nullptr;
	}

	Matrix* matrix = new Matrix(m1->rows, m2->cols);
	for (size_t i = 0; i < matrix->rows; i++) {
		for (size_t j = 0; j < matrix->cols; j++) {
			double sum = 0;
			for (size_t k = 0; k < m1->cols; k++) {
				sum += m1->data[i * m1->cols + k] * m2->data[k * m2->cols + j];
			}
			matrix->data[i * matrix->cols + j] = sum;
		}
	}
	return matrix;
}